

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O2

void __thiscall ast::UniaryOp::UniaryOp(UniaryOp *this,Token *t,int p,int a,int line)

{
  Token TStack_58;
  
  token::Token::Token(&TStack_58,t);
  Op::Op(&this->super_Op,&TStack_58,p,a,line,UniaryOpType);
  token::Token::~Token(&TStack_58);
  (this->super_Op).super_Expr.super_Node._vptr_Node = (_func_int **)&PTR__UniaryOp_00122968;
  this->RightOp = (Expr *)0x0;
  return;
}

Assistant:

UniaryOp(Token &t, int p, int a , int line)
        :Op(t, p, a, line, NodeType::UniaryOpType), RightOp{nullptr} {}